

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EscapeCodeGenerator.hpp
# Opt level: O2

EscapeCode * __thiscall
yb::ANSIEscapeCodeGenerator::cursorForward_abi_cxx11_
          (EscapeCode *__return_storage_ptr__,ANSIEscapeCodeGenerator *this,uint n)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48;
  allocator<char> local_21;
  
  if (n == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    if (n == 1) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"",&local_21);
    }
    else {
      std::__cxx11::to_string(&local_48,n);
    }
    std::operator+(&local_68,&this->EscapeCodeStart,&local_48);
    std::operator+(__return_storage_ptr__,&local_68,'C');
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

EscapeCode cursorForward(unsigned int n) const override {
        if (!n) return EscapeCode{};
        return EscapeCodeStart + (n == 1 ? "" : std::to_string(n)) + 'C';
    }